

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O0

char * __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
SnailAlloc(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this,Recycler *recycler,TBlockAllocatorType *allocator,size_t sizeCat,size_t size,
          ObjectInfoBits attributes,bool nothrow)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ConfigFlagsTable *pCVar4;
  char *pcVar5;
  undefined8 *in_FS_OFFSET;
  uint local_74;
  BOOL collected;
  char *memBlock;
  bool nothrow_local;
  ObjectInfoBits attributes_local;
  size_t size_local;
  size_t sizeCat_local;
  TBlockAllocatorType *allocator_local;
  Recycler *recycler_local;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *this_local
  ;
  
  pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
  if ((pCVar4->Verbose & 1U) != 0) {
    pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
    bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
    if (bVar2) {
      Output::Print(L"In SnailAlloc [Size: 0x%x, Attributes: 0x%x]\n",sizeCat,(ulong)attributes);
    }
  }
  if (sizeCat != (this->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x29a,"(sizeCat == this->sizeCat)","sizeCat == this->sizeCat");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x29b,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)TryAlloc(this,recycler,allocator,sizeCat,attributes);
  if (this_local ==
      (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *)0x0)
  {
    if ((recycler->disableCollectOnAllocationHeuristics & 1U) == 0) {
      local_74 = Recycler::CollectNow<(Memory::CollectionFlags)404819971>(recycler);
    }
    else {
      local_74 = Recycler::FinishConcurrent<(Memory::CollectionFlags)270008320>(recycler);
    }
    pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
    if ((pCVar4->Verbose & 1U) != 0) {
      pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
      bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
      if (bVar2) {
        Output::Print(L"TryAlloc failed, forced collection on allocation [Collected: %d]\n",
                      (ulong)local_74);
      }
    }
    if (local_74 == 0) {
      BVar3 = Recycler::IsConcurrentSweepExecutingState(recycler);
      if ((BVar3 != 0) &&
         ((ulong)(uint)Js::Configuration::Global._132484_4_ <
          (recycler->autoHeap).uncollectedNewPageCount)) {
        Recycler::FinishConcurrent<(Memory::CollectionFlags)147456>(recycler);
        pcVar5 = TryAlloc(this,recycler,allocator,sizeCat,attributes);
        if (pcVar5 != (char *)0x0) {
          return pcVar5;
        }
      }
      pcVar5 = TryAllocFromNewHeapBlock(this,recycler,allocator,sizeCat,size,attributes);
      if (pcVar5 != (char *)0x0) {
        return pcVar5;
      }
      pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
      if ((pCVar4->Verbose & 1U) != 0) {
        pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
        bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
        if (bVar2) {
          Output::Print(L"TryAllocFromNewHeapBlock failed, forcing in-thread collection\n");
        }
      }
      Recycler::CollectNow<(Memory::CollectionFlags)16384>(recycler);
    }
    this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                  *)SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                    ::SlowAlloc<true>(allocator,recycler,sizeCat,attributes);
    if (this_local ==
        (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *)
        0x0) {
      pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
      if ((pCVar4->Verbose & 1U) != 0) {
        pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
        bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
        if (bVar2) {
          Output::Print(L"SlowAlloc failed\n");
        }
      }
      this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                    *)TryAlloc(this,recycler,allocator,sizeCat,attributes);
      if (this_local ==
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *)
          0x0) {
        pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
        if ((pCVar4->Verbose & 1U) != 0) {
          pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
          bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
          if (bVar2) {
            Output::Print(L"TryAlloc failed\n");
          }
        }
        this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                      *)TryAllocFromNewHeapBlock(this,recycler,allocator,sizeCat,size,attributes);
        if (this_local ==
            (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
             *)0x0) {
          pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
          if ((pCVar4->Verbose & 1U) != 0) {
            pCVar4 = Recycler::GetRecyclerFlagsTable(recycler);
            bVar2 = Js::Phases::IsEnabled(&pCVar4->Trace,MemoryAllocationPhase);
            if (bVar2) {
              Output::Print(L"TryAllocFromNewHeapBlock failed- triggering OOM handler");
            }
          }
          if (!nothrow) {
            Recycler::OutOfMemory(recycler);
          }
          this_local = (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                        *)0x0;
        }
      }
    }
  }
  return (char *)this_local;
}

Assistant:

char *
HeapBucketT<TBlockType>::SnailAlloc(Recycler * recycler, TBlockAllocatorType * allocator, DECLSPEC_GUARD_OVERFLOW size_t sizeCat, size_t size, ObjectInfoBits attributes, bool nothrow)
{
    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("In SnailAlloc [Size: 0x%x, Attributes: 0x%x]\n"), sizeCat, attributes);

    Assert(sizeCat == this->sizeCat);
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    char * memBlock = this->TryAlloc(recycler, allocator, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

#if ENABLE_CONCURRENT_GC
    // No free memory, try to collect with allocated bytes and time heuristic, and concurrently
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? recycler->FinishConcurrent<FinishConcurrentOnAllocation>() :
        recycler->CollectNow<CollectOnAllocation>();
#else
    BOOL collected = recycler->disableCollectOnAllocationHeuristics ? FALSE : recycler->CollectNow<CollectOnAllocation>();
#endif

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAlloc failed, forced collection on allocation [Collected: %d]\n"), collected);

    if (!collected)
    {
#if ENABLE_CONCURRENT_GC
#if ENABLE_PARTIAL_GC
        // wait for background sweeping finish if there are too many pages allocated during background sweeping
        if (recycler->IsConcurrentSweepExecutingState() && recycler->autoHeap.uncollectedNewPageCount > (uint)CONFIG_FLAG(NewPagesCapDuringBGSweeping))
#else
        if (recycler->IsConcurrentSweepExecutingState())
#endif
        {
            recycler->FinishConcurrent<ForceFinishCollection>();
            memBlock = this->TryAlloc(recycler, allocator, sizeCat, attributes);
            if (memBlock != nullptr)
            {
                return memBlock;
            }
        }
#endif

        // We didn't collect, try to add a new heap block
        memBlock = TryAllocFromNewHeapBlock(recycler, allocator, sizeCat, size, attributes);
        if (memBlock != nullptr)
        {
            return memBlock;
        }

        // Can't even allocate a new block, we need force a collection and
        //allocate some free memory, add a new heap block again, or throw out of memory
        AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAllocFromNewHeapBlock failed, forcing in-thread collection\n"));
        recycler->CollectNow<CollectNowForceInThread>();
    }

    // Collection might trigger finalizer, which might allocate memory. So the allocator
    // might have a heap block already, try to allocate from that first
    memBlock = allocator->template SlowAlloc<true /* allow fault injection */>(recycler, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("SlowAlloc failed\n"));

    // do the allocation
    memBlock = this->TryAlloc(recycler, allocator, sizeCat, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAlloc failed\n"));
    // add a heap block if there are no preallocated memory left.
    memBlock = TryAllocFromNewHeapBlock(recycler, allocator, sizeCat, size, attributes);
    if (memBlock != nullptr)
    {
        return memBlock;
    }

    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TryAllocFromNewHeapBlock failed- triggering OOM handler"));

    if (nothrow == false)
    {
        // Can't add a heap block, we are out of memory
        // Since we're allowed to throw, throw right here
        recycler->OutOfMemory();
    }

    return nullptr;
}